

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compiler.cpp
# Opt level: O1

void __thiscall
GdlRenderer::DebugXmlClasses(GdlRenderer *this,ofstream *strmOut,string *staPathToCur)

{
  pointer pcVar1;
  GdlGlyphClassDefn *this_00;
  int iVar2;
  pointer ppGVar3;
  ulong uVar4;
  int cwGlyphIDs;
  int local_84;
  ofstream *local_80;
  string *local_78;
  string local_70;
  long *local_50 [2];
  long local_40 [2];
  
  local_80 = strmOut;
  local_78 = staPathToCur;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)strmOut,"  <classes>\n",0xc);
  ppGVar3 = (this->m_vpglfc).
            super__Vector_base<GdlGlyphClassDefn_*,_std::allocator<GdlGlyphClassDefn_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((this->m_vpglfc).super__Vector_base<GdlGlyphClassDefn_*,_std::allocator<GdlGlyphClassDefn_*>_>
      ._M_impl.super__Vector_impl_data._M_finish != ppGVar3) {
    uVar4 = 0;
    do {
      pcVar1 = (ppGVar3[uVar4]->m_staName)._M_dataplus._M_p;
      local_50[0] = local_40;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_50,pcVar1,pcVar1 + (ppGVar3[uVar4]->m_staName)._M_string_length);
      iVar2 = std::__cxx11::string::compare((char *)local_50);
      if (local_50[0] != local_40) {
        operator_delete(local_50[0],local_40[0] + 1);
      }
      if (iVar2 != 0) {
        local_84 = 0;
        this_00 = (this->m_vpglfc).
                  super__Vector_base<GdlGlyphClassDefn_*,_std::allocator<GdlGlyphClassDefn_*>_>.
                  _M_impl.super__Vector_impl_data._M_start[uVar4];
        pcVar1 = (local_78->_M_dataplus)._M_p;
        local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_70,pcVar1,pcVar1 + local_78->_M_string_length);
        GdlGlyphClassDefn::DebugXmlClasses(this_00,local_80,&local_84,&local_70);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p != &local_70.field_2) {
          operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
        }
      }
      uVar4 = uVar4 + 1;
      ppGVar3 = (this->m_vpglfc).
                super__Vector_base<GdlGlyphClassDefn_*,_std::allocator<GdlGlyphClassDefn_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
    } while (uVar4 < (ulong)((long)(this->m_vpglfc).
                                   super__Vector_base<GdlGlyphClassDefn_*,_std::allocator<GdlGlyphClassDefn_*>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)ppGVar3 >> 3))
    ;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_80,"  </classes>\n\n",0xe);
  return;
}

Assistant:

void GdlRenderer::DebugXmlClasses(std::ofstream & strmOut, std::string staPathToCur)		
{
	strmOut << "  <classes>\n";

	int cwGlyphIDs;
	for (size_t ipglfc = 0; ipglfc < m_vpglfc.size(); ipglfc++)
	{
		if (m_vpglfc[ipglfc]->Name() == "ANY")
			continue;

		cwGlyphIDs = 0;
		m_vpglfc[ipglfc]->DebugXmlClasses(strmOut, cwGlyphIDs, staPathToCur);
	}

	strmOut << "  </classes>\n\n";
}